

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>,_kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1823:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>,_kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1823:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  ExceptionOrValue *output_00;
  Exception *this_00;
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> depResult;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_> local_5d8;
  ExceptionOrValue local_460;
  char local_300;
  undefined8 *local_2f8;
  long *local_2f0;
  Exception local_2e8;
  Exception local_188;
  
  output_00 = &local_460;
  local_460.exception.ptr.isSet = false;
  local_300 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,output_00);
  uVar5 = local_460.exception.ptr.field_1.value.context.ptr.ptr;
  uVar4 = local_460.exception.ptr.field_1.value.description.content.size_;
  uVar3 = local_460.exception.ptr.field_1.value.description.content.ptr;
  uVar2 = local_460.exception.ptr.field_1.value.ownFile.content.size_;
  uVar1 = local_460.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_460.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_460.exception.ptr.field_1 + 0x50);
    local_188.ownFile.content.disposer =
         local_460.exception.ptr.field_1.value.ownFile.content.disposer;
    local_460.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_460.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_188.file = local_460.exception.ptr.field_1.value.file;
    local_188.line = local_460.exception.ptr.field_1.value.line;
    local_188.type = local_460.exception.ptr.field_1.value.type;
    local_188.description.content.disposer =
         local_460.exception.ptr.field_1.value.description.content.disposer;
    local_460.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_460.exception.ptr.field_1.value.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_460.exception.ptr.field_1.value.context.ptr.disposer;
    local_460.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_2e8.ownFile.content.disposer =
         local_460.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_2e8.file = local_460.exception.ptr.field_1.value.file;
    local_2e8.line = local_460.exception.ptr.field_1.value.line;
    local_2e8.type = local_460.exception.ptr.field_1.value.type;
    local_2e8.description.content.disposer =
         local_460.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_460.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,__src,0x104);
    local_5d8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar1
    ;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = uVar2;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_460.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8.ownFile.content.ptr = (char *)0x0;
    local_2e8.ownFile.content.size_ = 0;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_460.exception.ptr.field_1.value.file;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_460.exception.ptr.field_1._32_8_;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar3;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar4;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_460.exception.ptr.field_1.value.description.content.disposer;
    local_2e8.description.content.ptr = (char *)0x0;
    local_2e8.description.content.size_ = 0;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_460.exception.ptr.field_1.value.context.ptr.disposer;
    local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar5;
    local_2e8.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5d8.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5d8.value.ptr.isSet = false;
    Exception::~Exception(&local_2e8);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_> *)output,&local_5d8);
    uVar1 = local_5d8.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5d8.value.ptr.isSet == true) &&
       (local_5d8.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5d8.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5d8.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5d8.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar1)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar1)->_vptr_PromiseNode[-2]));
    }
    if (local_5d8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5d8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    this_00 = &local_188;
  }
  else {
    if (local_300 != '\x01') goto LAB_00465902;
    anon_class_1_0_00000001_for_func::operator()
              ((anon_class_1_0_00000001_for_func *)&local_2e8,
               (Maybe<kj::Own<kj::AsyncCapabilityStream>_> *)output_00);
    local_5d8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5d8.value.ptr.isSet = true;
    local_5d8.value.ptr.field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_2e8.ownFile.content.ptr;
    local_5d8.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)local_2e8.ownFile.content.size_;
    local_2e8.ownFile.content.size_ = 0;
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_> *)output,&local_5d8);
    uVar1 = local_5d8.value.ptr.field_1.value.super_PromiseBase.node.ptr;
    if ((local_5d8.value.ptr.isSet == true) &&
       (local_5d8.value.ptr.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
      local_5d8.value.ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_5d8.value.ptr.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_5d8.value.ptr.field_1.value.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)uVar1)->_vptr_PromiseNode +
                 (long)((PromiseNode *)uVar1)->_vptr_PromiseNode[-2]));
    }
    if (local_5d8.super_ExceptionOrValue.exception.ptr.isSet != true) goto LAB_00465902;
    this_00 = (Exception *)&local_5d8.super_ExceptionOrValue.exception.ptr.field_1;
  }
  Exception::~Exception(this_00);
LAB_00465902:
  plVar6 = local_2f0;
  if ((local_300 == '\x01') && (local_2f0 != (long *)0x0)) {
    local_2f0 = (long *)0x0;
    (**(code **)*local_2f8)(local_2f8,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  if (local_460.exception.ptr.isSet == true) {
    Exception::~Exception(&local_460.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }